

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O3

void solver_debug_check_trail(solver_t *s)

{
  uint *puVar1;
  vec_uint_t *pvVar2;
  vec_char_t *p;
  FILE *__stream;
  char cVar3;
  uint *__dest;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  size_t __size;
  ulong __nmemb;
  
  fprintf(_stdout,"[Satoko] Checking for trail(%u) inconsistencies...\n",(ulong)s->trail->size);
  pvVar2 = s->trail;
  if (pvVar2 == (vec_uint_t *)0x0) {
    __assert_fail("dest != NULL && src != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                  ,0xa0,"void vec_uint_duplicate(vec_uint_t *, const vec_uint_t *)");
  }
  uVar6 = (ulong)pvVar2->cap;
  if (uVar6 == 0) {
    __size = 0;
    __dest = (uint *)0x0;
  }
  else {
    __size = uVar6 * 4;
    __dest = (uint *)malloc(__size);
    if (__dest == (uint *)0x0) {
      __assert_fail("p->data != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                    ,0x5f,"void vec_uint_resize(vec_uint_t *, unsigned int)");
    }
  }
  memcpy(__dest,pvVar2->data,__size);
  __nmemb = (ulong)pvVar2->size;
  qsort(__dest,__nmemb,4,vec_uint_asc_compare);
  __stream = _stdout;
  if (1 < __nmemb) {
    uVar4 = 1;
    uVar5 = *__dest;
    do {
      puVar1 = __dest + uVar4;
      if ((*puVar1 ^ uVar5) == 1) {
        fprintf(_stdout,"[Satoko] Inconsistent trail: %u %u\n");
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver.c"
                      ,0x2c4,"void solver_debug_check_trail(solver_t *)");
      }
      uVar4 = uVar4 + 1;
      uVar5 = *puVar1;
    } while (__nmemb != uVar4);
  }
  if (__nmemb == 0) {
    fwrite("[Satoko] Trail OK.\n",0x13,1,_stdout);
    fprintf(_stdout,"Vector has %u(%u) entries: {",0,uVar6);
  }
  else {
    p = s->assigns;
    uVar4 = 0;
    do {
      uVar5 = __dest[uVar4] >> 1;
      if (p->size <= uVar5) {
        __assert_fail("idx >= 0 && idx < p->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_char.h"
                      ,0x85,"char vec_char_at(vec_char_t *, unsigned int)");
      }
      if (p->data[uVar5] != ((byte)__dest[uVar4] & 1)) {
        cVar3 = vec_char_at(p,uVar5);
        fprintf(__stream,"[Satoko] Inconsistent trail assignment: %u, %u\n",(ulong)(uint)(int)cVar3,
                (ulong)__dest[uVar4]);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/solver.c"
                      ,0x2cb,"void solver_debug_check_trail(solver_t *)");
      }
      uVar4 = uVar4 + 1;
    } while (__nmemb != uVar4);
    fwrite("[Satoko] Trail OK.\n",0x13,1,_stdout);
    fprintf(_stdout,"Vector has %u(%u) entries: {",__nmemb,uVar6);
    if (__nmemb != 0) {
      uVar6 = 0;
      do {
        fprintf(_stdout," %u",(ulong)__dest[uVar6]);
        uVar6 = uVar6 + 1;
      } while (__nmemb != uVar6);
      fwrite(" }\n",3,1,_stdout);
      goto LAB_008f8cc5;
    }
  }
  fwrite(" }\n",3,1,_stdout);
  if (__dest == (uint *)0x0) {
    return;
  }
LAB_008f8cc5:
  free(__dest);
  return;
}

Assistant:

void solver_debug_check_trail(solver_t *s)
{
    unsigned i;
    unsigned *array;
    vec_uint_t *trail_dup = vec_uint_alloc(0);
    fprintf(stdout, "[Satoko] Checking for trail(%u) inconsistencies...\n", vec_uint_size(s->trail));
    vec_uint_duplicate(trail_dup, s->trail);
    vec_uint_sort(trail_dup, 1);
    array = vec_uint_data(trail_dup);
    for (i = 1; i < vec_uint_size(trail_dup); i++) {
        if (array[i - 1] == lit_compl(array[i])) {
            fprintf(stdout, "[Satoko] Inconsistent trail: %u %u\n", array[i - 1], array[i]);
            assert(0);
            return;
        }
    }
    for (i = 0; i < vec_uint_size(trail_dup); i++) {
        if (var_value(s, lit2var(array[i])) != lit_polarity(array[i])) {
            fprintf(stdout, "[Satoko] Inconsistent trail assignment: %u, %u\n", vec_char_at(s->assigns, lit2var(array[i])), array[i]);
            assert(0);
            return;
        }
    }
    fprintf(stdout, "[Satoko] Trail OK.\n");
    vec_uint_print(trail_dup);
    vec_uint_free(trail_dup);

}